

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

bool __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::skip_bom(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
           *this)

{
  bool bVar1;
  int_type iVar2;
  
  iVar2 = get(this);
  if (iVar2 == 0xef) {
    iVar2 = get(this);
    if (iVar2 == 0xbb) {
      iVar2 = get(this);
      bVar1 = iVar2 == 0xbf;
    }
    else {
      bVar1 = false;
    }
  }
  else {
    unget(this);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool skip_bom() {
		if (get() == 0xEF) {
			// check if we completely parse the BOM
			return get() == 0xBB and get() == 0xBF;
		}

		// the first character is not the beginning of the BOM; unget it to
		// process is later
		unget();
		return true;
	}